

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_attach__internal(void *uuid_,void *protocol_)

{
  char *pcVar1;
  undefined1 *puVar2;
  char cVar3;
  undefined1 uVar4;
  char cVar5;
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  fio_data_s *pfVar6;
  int *extraout_RAX;
  int *extraout_RAX_00;
  int *piVar7;
  int *extraout_RAX_01;
  long lVar8;
  uint uVar9;
  long lVar10;
  fio_lock_i ret;
  timespec local_78;
  long local_68;
  code *local_60;
  void *pvStack_58;
  void *local_50;
  code *local_48;
  void *pvStack_40;
  void *local_38;
  
  if (protocol_ != (void *)0x0) {
    if (*(long *)((long)protocol_ + 0x18) == 0) {
      *(code **)((long)protocol_ + 0x18) = mock_on_ev;
    }
    if (*protocol_ == 0) {
      *(code **)protocol_ = mock_on_data;
    }
    if (*(long *)((long)protocol_ + 8) == 0) {
      *(code **)((long)protocol_ + 8) = mock_on_ev;
    }
    if (*(long *)((long)protocol_ + 0x20) == 0) {
      *(code **)((long)protocol_ + 0x20) = mock_ping;
    }
    if (*(long *)((long)protocol_ + 0x10) == 0) {
      *(code **)((long)protocol_ + 0x10) = mock_on_shutdown;
    }
    *(undefined2 *)((long)protocol_ + 0x28) = 0;
    *(undefined1 *)((long)protocol_ + 0x2a) = 0;
    *(undefined1 *)((long)protocol_ + 0x2b) = 0;
  }
  pfVar6 = fio_data;
  if (-1 < (long)uuid_) {
    uVar9 = (uint)((ulong)uuid_ >> 8);
    if (uVar9 < fio_data->capa) {
      lVar8 = (long)(int)uVar9;
      lVar10 = lVar8 * 0xa8;
      cVar5 = *(char *)((long)fio_data + lVar10 + 0x6d);
      if (cVar5 == (char)uuid_) {
        LOCK();
        pcVar1 = (char *)((long)fio_data + lVar10 + 0x6c);
        cVar3 = *pcVar1;
        *pcVar1 = '\x01';
        UNLOCK();
        local_68 = lVar8;
        if (cVar3 != '\0') {
          do {
            local_78.tv_sec = 0;
            local_78.tv_nsec = 1;
            nanosleep(&local_78,(timespec *)0x0);
            LOCK();
            pcVar1 = (char *)((long)pfVar6 + lVar10 + 0x6c);
            cVar3 = *pcVar1;
            *pcVar1 = '\x01';
            UNLOCK();
          } while (cVar3 != '\0');
        }
        pfVar6 = fio_data;
        if ((uVar9 < fio_data->capa) && (*(char *)((long)fio_data + lVar10 + 0x6d) == cVar5)) {
          local_38 = *(void **)((long)fio_data + lVar10 + 0x58);
          *(undefined1 *)((long)fio_data + lVar10 + 0x6f) = 1;
          *(void **)((long)pfVar6 + lVar10 + 0x58) = protocol_;
          *(__time_t *)((long)pfVar6 + lVar10 + 0x60) = (pfVar6->last_cycle).tv_sec;
          LOCK();
          puVar2 = (undefined1 *)((long)pfVar6 + lVar10 + 0x6c);
          uVar4 = *puVar2;
          *puVar2 = 0;
          UNLOCK();
          local_78.tv_sec = CONCAT71(local_78.tv_sec._1_7_,uVar4);
          if (local_38 == (void *)0x0) {
            piVar7 = (int *)0x0;
            if (protocol_ != (void *)0x0) {
              fio_poll_add(local_68);
              piVar7 = extraout_RAX_01;
            }
          }
          else {
            local_48 = deferred_on_close;
            task.arg1 = uuid_;
            task.func = deferred_on_close;
            task.arg2 = local_38;
            pvStack_40 = uuid_;
            fio_defer_push_task_fn(task,&task_queue_normal);
            lVar8 = local_68;
            piVar7 = extraout_RAX;
            if (protocol_ == (void *)0x0) {
              fio_poll_remove_fd(local_68);
              fio_poll_add_write(lVar8);
              piVar7 = extraout_RAX_00;
            }
          }
          goto LAB_00109308;
        }
        LOCK();
        puVar2 = (undefined1 *)((long)fio_data + lVar10 + 0x6c);
        uVar4 = *puVar2;
        *puVar2 = 0;
        UNLOCK();
        local_78.tv_sec = CONCAT71(local_78.tv_sec._1_7_,uVar4);
      }
    }
  }
  if (protocol_ != (void *)0x0) {
    local_60 = deferred_on_close;
    task_00.arg1 = uuid_;
    task_00.func = deferred_on_close;
    task_00.arg2 = protocol_;
    pvStack_58 = uuid_;
    local_50 = protocol_;
    fio_defer_push_task_fn(task_00,&task_queue_normal);
  }
  piVar7 = __errno_location();
  if (uuid_ == (void *)0xffffffffffffffff) {
    *piVar7 = 9;
  }
  else {
    *piVar7 = 0x6b;
  }
LAB_00109308:
  return (int)piVar7;
}

Assistant:

static int fio_attach__internal(void *uuid_, void *protocol_) {
  intptr_t uuid = (intptr_t)uuid_;
  fio_protocol_s *protocol = (fio_protocol_s *)protocol_;
  if (protocol) {
    if (!protocol->on_close) {
      protocol->on_close = mock_on_ev;
    }
    if (!protocol->on_data) {
      protocol->on_data = mock_on_data;
    }
    if (!protocol->on_ready) {
      protocol->on_ready = mock_on_ev;
    }
    if (!protocol->ping) {
      protocol->ping = mock_ping;
    }
    if (!protocol->on_shutdown) {
      protocol->on_shutdown = mock_on_shutdown;
    }
    prt_meta(protocol) = (protocol_metadata_s){.rsv = 0};
  }
  if (!uuid_is_valid(uuid))
    goto invalid_uuid_unlocked;
  fio_lock(&uuid_data(uuid).protocol_lock);
  if (!uuid_is_valid(uuid)) {
    goto invalid_uuid;
  }
  fio_protocol_s *old_pr = uuid_data(uuid).protocol;
  uuid_data(uuid).open = 1;
  uuid_data(uuid).protocol = protocol;
  touchfd(fio_uuid2fd(uuid));
  fio_unlock(&uuid_data(uuid).protocol_lock);
  if (old_pr) {
    /* protocol replacement */
    fio_defer_push_task(deferred_on_close, (void *)uuid, old_pr);
    if (!protocol) {
      /* hijacking */
      fio_poll_remove_fd(fio_uuid2fd(uuid));
      fio_poll_add_write(fio_uuid2fd(uuid));
    }
  } else if (protocol) {
    /* adding a new uuid to the reactor */
    fio_poll_add(fio_uuid2fd(uuid));
  }
  return 0;

invalid_uuid:
  fio_unlock(&uuid_data(uuid).protocol_lock);
invalid_uuid_unlocked:
  // FIO_LOG_DEBUG("fio_attach failed for invalid uuid %p", (void *)uuid);
  if (protocol)
    fio_defer_push_task(deferred_on_close, (void *)uuid, protocol);
  if (uuid == -1)
    errno = EBADF;
  else
    errno = ENOTCONN;
  return -1;
}